

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5_utils.c
# Opt level: O2

void MD5Update(MD5Context *ctx,uchar *buf,uint len)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  uint *in;
  size_t __n;
  
  uVar1 = ctx->bytes[0];
  ctx->bytes[0] = uVar1 + len;
  if (CARRY4(uVar1,len)) {
    ctx->bytes[1] = ctx->bytes[1] + 1;
  }
  uVar9 = 0x40 - (ulong)(uVar1 & 0x3f);
  __n = (size_t)(len - (uint)uVar9);
  if (len < (uint)uVar9) {
    in = (uint *)((long)ctx + (0x58 - uVar9));
    __n = (size_t)len;
  }
  else {
    in = ctx->in;
    uVar9 = uVar9 & 0xffffffff;
    memcpy((void *)((long)ctx + (0x58 - uVar9)),buf,uVar9);
    MD5Transform(ctx->buf,in);
    buf = buf + uVar9;
    for (; 0x3f < (uint)__n; __n = __n - 0x40) {
      uVar2 = *(undefined8 *)buf;
      uVar3 = *(undefined8 *)(buf + 8);
      uVar4 = *(undefined8 *)(buf + 0x10);
      uVar5 = *(undefined8 *)(buf + 0x18);
      uVar6 = *(undefined8 *)(buf + 0x20);
      uVar7 = *(undefined8 *)(buf + 0x28);
      uVar8 = *(undefined8 *)(buf + 0x38);
      *(undefined8 *)(ctx->in + 0xc) = *(undefined8 *)(buf + 0x30);
      *(undefined8 *)(ctx->in + 0xe) = uVar8;
      *(undefined8 *)(ctx->in + 8) = uVar6;
      *(undefined8 *)(ctx->in + 10) = uVar7;
      *(undefined8 *)(ctx->in + 4) = uVar4;
      *(undefined8 *)(ctx->in + 6) = uVar5;
      *(undefined8 *)in = uVar2;
      *(undefined8 *)(ctx->in + 2) = uVar3;
      MD5Transform(ctx->buf,in);
      buf = buf + 0x40;
    }
  }
  memcpy(in,buf,__n);
  return;
}

Assistant:

void MD5Update(struct MD5Context *ctx, md5byte const *buf, unsigned len) {
  UWORD32 t;

  /* Update byte count */

  t = ctx->bytes[0];

  if ((ctx->bytes[0] = t + len) < t)
    ctx->bytes[1]++; /* Carry from low to high */

  t = 64 - (t & 0x3f); /* Space available in ctx->in (at least 1) */

  if (t > len) {
    memcpy((md5byte *)ctx->in + 64 - t, buf, len);
    return;
  }

  /* First chunk is an odd size */
  memcpy((md5byte *)ctx->in + 64 - t, buf, t);
  byteSwap(ctx->in, 16);
  MD5Transform(ctx->buf, ctx->in);
  buf += t;
  len -= t;

  /* Process data in 64-byte chunks */
  while (len >= 64) {
    memcpy(ctx->in, buf, 64);
    byteSwap(ctx->in, 16);
    MD5Transform(ctx->buf, ctx->in);
    buf += 64;
    len -= 64;
  }

  /* Handle any remaining bytes of data. */
  memcpy(ctx->in, buf, len);
}